

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

void __thiscall
kj::Lazy<unsigned_int>::
InitImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++:197:3)>
::run(InitImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:197:3)>
      *this)

{
  Lazy<unsigned_int> *pLVar1;
  Own<unsigned_int> local_18;
  
  pLVar1 = this->lazy;
  local_18.ptr = (uint *)&pLVar1->space;
  (pLVar1->space).field_0.value = 0x315;
  local_18.disposer = (Disposer *)&DestructorOnlyDisposer<unsigned_int>::instance;
  Own<unsigned_int>::operator=(&pLVar1->value,&local_18);
  if ((SpaceFor<unsigned_int> *)local_18.ptr != (SpaceFor<unsigned_int> *)0x0) {
    local_18.ptr = (uint *)0x0;
    (**(local_18.disposer)->_vptr_Disposer)();
  }
  return;
}

Assistant:

void run() override {
    lazy.value = func(lazy.space);
  }